

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmac.cpp
# Opt level: O3

int VHASH_TestSpeedAlt(void *key,int len,int iter)

{
  uint uVar1;
  uint uVar2;
  uint64_t uVar3;
  undefined4 in_register_00000014;
  uint64_t *tagl;
  uint64_t *extraout_RDX;
  uint64_t *extraout_RDX_00;
  uint mbytes;
  uchar *m;
  int iVar4;
  int alignedLn;
  uchar lastBlock [144];
  uchar local_c8 [152];
  
  tagl = (uint64_t *)CONCAT44(in_register_00000014,iter);
  if (iter < 1) {
    iVar4 = 0;
  }
  else {
    uVar1 = len;
    if (len < 0) {
      uVar1 = len + 0x7fU;
    }
    iVar4 = 0;
    uVar2 = len % 0x80;
    do {
      m = (uchar *)key;
      mbytes = len;
      if ((len & 0xfU) != 0) {
        if (0xfe < len + 0x7fU) {
          vhash_update((uchar *)key,uVar1 & 0xffffff80,&vhi.ctx);
        }
        memcpy(local_c8,(void *)((long)(int)(uVar1 & 0xffffff80) + (long)key),(long)(int)uVar2);
        memset(local_c8 + (int)uVar2,0,(ulong)(0x10 - (len & 0xfU)));
        tagl = extraout_RDX;
        m = local_c8;
        mbytes = uVar2;
      }
      uVar3 = vhash(m,mbytes,tagl,&vhi.ctx);
      iVar4 = iVar4 + (int)uVar3;
      iter = iter + -1;
      tagl = extraout_RDX_00;
    } while (iter != 0);
  }
  return iVar4;
}

Assistant:

int VHASH_TestSpeedAlt( const void * key, int len, int iter )
{
	int dummy = 0;
    uint64_t tagl;
	for ( int i=0; i<iter; i++ )
	{
		if (len & 0xF)
		{
			int blcCnt = len / VMAC_NHBYTES;
			int alignedLn = blcCnt * VMAC_NHBYTES;

			if (alignedLn) 
				vhash_update((unsigned char*)key, alignedLn, &(vhi.ctx));

			ALIGN(16) unsigned char lastBlock[VMAC_NHBYTES + 16];
			int bytesRemaining = len - alignedLn;
			memcpy(lastBlock, (unsigned char*)key + alignedLn, bytesRemaining);
			int bytesRemaining16aligned = ( ( bytesRemaining >> 4) << 4 ) + 16;
			memset(lastBlock + bytesRemaining, 0, bytesRemaining16aligned - bytesRemaining );

			uint64_t tagl;
#if (VMAC_TAG_LEN == 128)
			dummy += vhash((unsigned char *)lastBlock, bytesRemaining, &tagl, &(vhi.ctx));
#elif (VMAC_TAG_LEN == 64)
			dummy += vhash((unsigned char *)lastBlock, bytesRemaining, &tagl, &(vhi.ctx));
#else
#error VMAC_TAG_LEN could be either 64 or 128
#endif
		}
		else // size is a multiple of 16
		{
			uint64_t tagl;
#if (VMAC_TAG_LEN == 128)
			*(uint64_t*)res = vhash((unsigned char *)lastBlock, bytesRemaining + 1, &tagl, &(vhi.ctx));
#elif (VMAC_TAG_LEN == 64)
			dummy += vhash((unsigned char *)key, len, &tagl, &(vhi.ctx));
#else
#error VMAC_TAG_LEN could be either 64 or 128
#endif
		}
	}
	return dummy;
}